

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_SET_OF.c
# Opt level: O2

int SET_OF_encode_xer_callback(void *buffer,size_t size,void *key)

{
  size_t __size;
  void *__ptr;
  long lVar1;
  
  __ptr = *key;
  lVar1 = *(long *)((long)key + 8);
  if (*(ulong *)((long)key + 0x10) <= lVar1 + size) {
    __size = size + *(ulong *)((long)key + 0x10) * 4;
    __ptr = realloc(__ptr,__size);
    if (__ptr == (void *)0x0) {
      return -1;
    }
    *(void **)key = __ptr;
    *(size_t *)((long)key + 0x10) = __size;
    lVar1 = *(long *)((long)key + 8);
  }
  memcpy((void *)(lVar1 + (long)__ptr),buffer,size);
  *(long *)((long)key + 8) = *(long *)((long)key + 8) + size;
  return 0;
}

Assistant:

static int
SET_OF_encode_xer_callback(const void *buffer, size_t size, void *key) {
	xer_tmp_enc_t *t = (xer_tmp_enc_t *)key;
	if(t->offset + size >= t->size) {
		size_t newsize = (t->size << 2) + size;
		void *p = REALLOC(t->buffer, newsize);
		if(!p) return -1;
		t->buffer = p;
		t->size = newsize;
	}
	memcpy((char *)t->buffer + t->offset, buffer, size);
	t->offset += size;
	return 0;
}